

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtendedKalmanFilter.cpp
# Opt level: O3

bool __thiscall
iDynTree::DiscreteExtendedKalmanFilterHelper::ekfReset
          (DiscreteExtendedKalmanFilterHelper *this,size_t *state_size,size_t *input_size,
          size_t *output_size,Span<double,__1L> *x0,Span<double,__1L> *P0,Span<double,__1L> *Q,
          Span<double,__1L> *R)

{
  bool bVar1;
  
  this->m_initial_state_covariance_set = false;
  this->m_is_initialized = false;
  this->m_measurement_updated = false;
  this->m_input_updated = false;
  this->m_initial_state_set = false;
  this->m_dim_X = *state_size;
  this->m_dim_U = *input_size;
  this->m_dim_Y = *output_size;
  bVar1 = ekfInit(this);
  if (bVar1) {
    bVar1 = ekfSetInitialState(this,x0);
    if (bVar1) {
      bVar1 = ekfSetStateCovariance(this,P0);
      if (bVar1) {
        bVar1 = ekfSetSystemNoiseCovariance(this,Q);
        if (bVar1) {
          bVar1 = ekfSetMeasurementNoiseCovariance(this,R);
          return bVar1;
        }
      }
    }
  }
  return false;
}

Assistant:

bool iDynTree::DiscreteExtendedKalmanFilterHelper::ekfReset(const size_t& state_size, const size_t& input_size, const size_t& output_size,
                                                                                                        const iDynTree::Span<double>& x0, const iDynTree::Span<double>& P0,
                                                                                                        const iDynTree::Span<double>& Q, const iDynTree::Span<double>& R)
{
    m_is_initialized = false;
    m_measurement_updated = false;
    m_input_updated = false;
    m_initial_state_set = false;
    m_initial_state_covariance_set = false;

    if (!ekfInit(state_size, input_size, output_size))
    {
        return false;
    }

    if (!ekfSetInitialState(x0))
    {
        return false;
    }

    if (!ekfSetStateCovariance(P0))
    {
        return false;
    }

    if (!ekfSetSystemNoiseCovariance(Q))
    {
        return false;
    }

    if (!ekfSetMeasurementNoiseCovariance(R))
    {
        return false;
    }

    return true;
}